

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O0

void swap_buf(void *buf,int32 el_sz,int32 n_el)

{
  uint32 *buf32;
  uint16 *buf16;
  int32 i;
  int32 n_el_local;
  int32 el_sz_local;
  void *buf_local;
  
  if (el_sz != 1) {
    if (el_sz == 2) {
      for (buf16._4_4_ = 0; buf16._4_4_ < n_el; buf16._4_4_ = buf16._4_4_ + 1) {
        *(ushort *)((long)buf + (long)buf16._4_4_ * 2) =
             *(ushort *)((long)buf + (long)buf16._4_4_ * 2) >> 8 |
             *(short *)((long)buf + (long)buf16._4_4_ * 2) << 8;
      }
    }
    else {
      if (el_sz != 4) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                ,0x13f,"Unsupported elemsize for byteswapping: %d\n",(ulong)(uint)el_sz);
        exit(1);
      }
      for (buf16._4_4_ = 0; buf16._4_4_ < n_el; buf16._4_4_ = buf16._4_4_ + 1) {
        *(uint *)((long)buf + (long)buf16._4_4_ * 4) =
             *(uint *)((long)buf + (long)buf16._4_4_ * 4) >> 0x18 |
             *(uint *)((long)buf + (long)buf16._4_4_ * 4) >> 8 & 0xff00 |
             (*(uint *)((long)buf + (long)buf16._4_4_ * 4) & 0xff00) << 8 |
             *(int *)((long)buf + (long)buf16._4_4_ * 4) << 0x18;
      }
    }
  }
  return;
}

Assistant:

static void
swap_buf(void *buf, int32 el_sz, int32 n_el)
{
    int32 i;
    uint16 *buf16;
    uint32 *buf32;

    switch (el_sz) {
    case 1:
        break;
    case 2:
        buf16 = (uint16 *) buf;
        for (i = 0; i < n_el; i++)
            SWAP_INT16(buf16 + i);
        break;
    case 4:
        buf32 = (uint32 *) buf;
        for (i = 0; i < n_el; i++)
            SWAP_INT32(buf32 + i);
        break;
    default:
        E_FATAL("Unsupported elemsize for byteswapping: %d\n", el_sz);
        break;
    }
}